

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_types.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::thrift::Dependencies::read(Dependencies *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
  *this_00;
  pointer pDVar1;
  pointer pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  long lVar8;
  pointer pDVar9;
  uint32_t _size2;
  int16_t fid;
  TType ftype;
  TType _etype5;
  string fname;
  uint local_74;
  short local_6e;
  int local_6c;
  ulong local_68;
  Dependencies *local_60;
  undefined1 local_54 [4];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar3 = (*this_01->_vptr_TProtocol[0x19])(this_01,&local_50);
  this_00 = &this->links;
  local_68 = 0;
  local_60 = this;
  do {
    iVar4 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&local_50,&local_6c,&local_6e);
    iVar4 = iVar4 + iVar3;
    if (local_6c == 0) {
      iVar3 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if ((local_68 & 1) == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar6[1] = puVar6 + 3;
        puVar6[2] = 0;
        *(undefined1 *)(puVar6 + 3) = 0;
        *puVar6 = &PTR__TException_00272740;
        *(undefined4 *)(puVar6 + 5) = 1;
        __cxa_throw(puVar6,&apache::thrift::protocol::TProtocolException::typeinfo,
                    apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    if (local_6e == 1) {
      if (local_6c != 0xf) {
        iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_0020b2a5;
      }
      pDVar1 = (this->links).
               super__Vector_base<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 = (this->links).
               super__Vector_base<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pDVar9 = pDVar1;
      if (pDVar2 != pDVar1) {
        do {
          (*(code *)**(undefined8 **)pDVar9)(pDVar9);
          pDVar9 = pDVar9 + 1;
        } while (pDVar9 != pDVar2);
        (local_60->links).
        super__Vector_base<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar1;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x1f])(this_01,local_54,&local_74);
      std::
      vector<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
      ::resize(this_00,(ulong)local_74);
      this = local_60;
      iVar5 = iVar5 + iVar4;
      if (local_74 != 0) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          pDVar1 = (this_00->
                   super__Vector_base<jaegertracing::thrift::DependencyLink,_std::allocator<jaegertracing::thrift::DependencyLink>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar3 = (**(code **)(*(long *)(&pDVar1->field_0x0 + lVar8) + 0x10))
                            (&pDVar1->field_0x0 + lVar8,this_01);
          iVar5 = iVar5 + iVar3;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x50;
        } while (uVar7 < local_74);
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x20])(this_01);
      iVar5 = iVar3 + iVar5;
      local_68 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
    }
    else {
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
LAB_0020b2a5:
      iVar5 = iVar5 + iVar4;
    }
    iVar3 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t Dependencies::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_links = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->links.clear();
            uint32_t _size2;
            ::apache::thrift::protocol::TType _etype5;
            xfer += iprot->readListBegin(_etype5, _size2);
            this->links.resize(_size2);
            uint32_t _i6;
            for (_i6 = 0; _i6 < _size2; ++_i6)
            {
              xfer += this->links[_i6].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_links = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_links)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}